

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::TextureBuffer::TextureBuffer
          (TextureBuffer *this,int dim_,TextureFormat format_,uint sizeX_,uint sizeY_)

{
  runtime_error *this_00;
  
  this->_vptr_TextureBuffer = (_func_int **)&PTR__TextureBuffer_004b97c0;
  this->dim = dim_;
  this->format = format_;
  this->sizeX = sizeX_;
  this->sizeY = sizeY_;
  if (sizeX_ < 0x400001) {
    if (sizeY_ < 0x400001 || dim_ < 2) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"OpenGL error: invalid texture dimensions");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"OpenGL error: invalid texture dimensions");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TextureBuffer::TextureBuffer(int dim_, TextureFormat format_, unsigned int sizeX_, unsigned int sizeY_)
    : dim(dim_), format(format_), sizeX(sizeX_), sizeY(sizeY_) {
  if (sizeX > (1 << 22)) throw std::runtime_error("OpenGL error: invalid texture dimensions");
  if (dim > 1 && sizeY > (1 << 22)) throw std::runtime_error("OpenGL error: invalid texture dimensions");
}